

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::setupHeapTypes(TranslateToFuzzReader *this)

{
  bool bVar1;
  Index IVar2;
  undefined4 uVar3;
  Error *arg;
  Fatal *pFVar4;
  mapped_type *this_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar5;
  reference pHVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  reference pHVar9;
  size_type sVar10;
  const_reference pvVar11;
  mapped_type *this_01;
  mapped_type *this_02;
  key_type local_430 [2];
  pair<wasm::HeapType,_unsigned_int> local_420;
  uint local_40c;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *pvStack_408;
  Index i_1;
  FieldList *fields_1;
  HeapType type_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1_1;
  int local_3d4;
  HeapType local_3d0;
  HeapType local_3c8;
  HeapType local_3c0;
  pair<wasm::HeapType,_unsigned_int> local_3b8;
  uint local_3a4;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *pvStack_3a0;
  Index i;
  FieldList *fields;
  HeapType local_390;
  HeapType local_388;
  HeapType local_380;
  BasicHeapType local_378;
  BasicHeapType local_374;
  BasicHeapType func;
  BasicHeapType any;
  BasicHeapType eq;
  BasicHeapType array;
  BasicHeapType struct_;
  Shareability share;
  HeapType subType;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  HeapType type_1;
  iterator __end1;
  iterator __begin1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1;
  SubTypes subTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Name local_288;
  HeapType local_278;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  Error *err;
  BuildResult result;
  undefined1 local_88 [8];
  HeapTypeGenerator generator;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> possibleHeapTypes;
  TranslateToFuzzReader *this_local;
  
  possibleHeapTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  wasm::ModuleUtils::collectHeapTypes((Module *)&stack0xffffffffffffffd8);
  HeapTypeGenerator::getInhabitable
            (&local_40,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffffd8);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
            (&this->interestingHeapTypes,&local_40);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_40);
  bVar1 = FeatureSet::hasGC(&this->wasm->features);
  if (bVar1) {
    result.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._28_4_ =
         (this->wasm->features).features;
    IVar2 = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES);
    HeapTypeGenerator::create
              ((HeapTypeGenerator *)local_88,&this->random,
               (FeatureSet)
               result.
               super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .
               super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               _28_4_,(ulong)IVar2);
    wasm::TypeBuilder::build();
    arg = TypeBuilder::BuildResult::getError((BuildResult *)&err);
    if (arg != (Error *)0x0) {
      Fatal::Fatal((Fatal *)&inhabitable.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      pFVar4 = Fatal::operator<<((Fatal *)&inhabitable.
                                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (char (*) [29])"Failed to build heap types: ");
      pFVar4 = Fatal::operator<<(pFVar4,&arg->reason);
      pFVar4 = Fatal::operator<<(pFVar4,(char (*) [11])" at index ");
      Fatal::operator<<(pFVar4,&arg->index);
      Fatal::~Fatal((Fatal *)&inhabitable.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pvVar5 = TypeBuilder::BuildResult::operator*((BuildResult *)&err);
    HeapTypeGenerator::makeInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2,pvVar5);
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar1) {
      pHVar9 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      local_278.id = pHVar9->id;
      bVar1 = HeapType::isBottom(&local_278);
      if ((!bVar1) && (bVar1 = HeapType::isBasic(&local_278), !bVar1)) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (&this->interestingHeapTypes,&local_278);
        bVar1 = oneIn(this,2);
        if (bVar1) {
          sVar10 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                             (&this->interestingHeapTypes);
          std::__cxx11::to_string((string *)&subTypes.typeSubTypes._M_h._M_single_bucket,sVar10);
          std::operator+(&local_2a8,"generated_type$",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &subTypes.typeSubTypes._M_h._M_single_bucket);
          Name::Name(&local_288,&local_2a8);
          this_00 = std::
                    unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                    ::operator[](&this->wasm->typeNames,&local_278);
          Name::operator=(&this_00->name,&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&subTypes.typeSubTypes._M_h._M_single_bucket);
        }
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
    TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err);
    HeapTypeGenerator::~HeapTypeGenerator((HeapTypeGenerator *)local_88);
  }
  SubTypes::SubTypes((SubTypes *)&__range1,&this->interestingHeapTypes);
  __end1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     (&this->interestingHeapTypes);
  type_1.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        (&this->interestingHeapTypes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type_1), bVar1) {
    pHVar9 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end1);
    __range2_1 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pHVar9->id;
    pvVar5 = SubTypes::getImmediateSubTypes((SubTypes *)&__range1,(HeapType)__range2_1);
    __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(pvVar5);
    subType.id = (uintptr_t)
                 std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                               *)&subType), bVar1) {
      pHVar6 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2_1);
      _struct_ = pHVar6->id;
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,(key_type *)&__range2_1);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&struct_);
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2_1);
    }
    array = wasm::HeapType::getShared();
    eq = HeapType::getBasic((HeapType *)&HeapTypes::struct_,array);
    any = HeapType::getBasic((HeapType *)&HeapTypes::array,array);
    func = HeapType::getBasic((HeapType *)&HeapTypes::eq,array);
    local_374 = HeapType::getBasic((HeapType *)&HeapTypes::any,array);
    local_378 = HeapType::getBasic((HeapType *)&HeapTypes::func,array);
    uVar3 = wasm::HeapType::getKind();
    switch(uVar3) {
    case 0:
      wasm::handle_unreachable
                ("unexpected kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x209);
    case 1:
      HeapType::HeapType(&local_380,local_378);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_380);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      break;
    case 2:
      HeapType::HeapType(&local_388,eq);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_388);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      HeapType::HeapType(&local_390,func);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_390);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      HeapType::HeapType((HeapType *)&fields,local_374);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,(key_type *)&fields);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      pvStack_3a0 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct()
      ;
      for (local_3a4 = 0; uVar8 = (ulong)local_3a4,
          sVar10 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(pvStack_3a0),
          uVar8 < sVar10; local_3a4 = local_3a4 + 1) {
        pvVar11 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                            (pvStack_3a0,(ulong)local_3a4);
        if (pvVar11->mutable_ != Immutable) {
          std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
                    (&local_3b8,(HeapType *)&__range2_1,&local_3a4);
          std::
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::push_back(&this->mutableStructFields,&local_3b8);
        }
      }
      break;
    case 3:
      HeapType::HeapType(&local_3c0,any);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_3c0);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      HeapType::HeapType(&local_3c8,func);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_3c8);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      HeapType::HeapType(&local_3d0,local_374);
      pmVar7 = std::
               unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[](&this->interestingHeapSubTypes,&local_3d0);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (pmVar7,(value_type *)&__range2_1);
      wasm::HeapType::getArray();
      if (local_3d4 != 0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (&this->mutableArrays,(value_type *)&__range2_1);
      }
      break;
    case 4:
      wasm::handle_unreachable
                ("TODO: cont",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x207);
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       (&this->interestingHeapTypes);
  type_2.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        (&this->interestingHeapTypes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                             *)&type_2), bVar1) {
    pHVar9 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end1_1);
    fields_1 = (FieldList *)pHVar9->id;
    bVar1 = HeapType::isStruct((HeapType *)&fields_1);
    if (bVar1) {
      pvStack_408 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)wasm::HeapType::getStruct()
      ;
      for (local_40c = 0; uVar8 = (ulong)local_40c,
          sVar10 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(pvStack_408),
          uVar8 < sVar10; local_40c = local_40c + 1) {
        pvVar11 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                            (pvStack_408,(ulong)local_40c);
        this_01 = std::
                  unordered_map<wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>_>
                  ::operator[](&this->typeStructFields,&pvVar11->type);
        std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
                  (&local_420,(HeapType *)&fields_1,&local_40c);
        std::
        vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
        ::push_back(this_01,&local_420);
      }
    }
    else {
      bVar1 = HeapType::isArray((HeapType *)&fields_1);
      if (bVar1) {
        wasm::HeapType::getArray();
        this_02 = std::
                  unordered_map<wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                  ::operator[](&this->typeArrays,local_430);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (this_02,(value_type *)&fields_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end1_1);
  }
  SubTypes::~SubTypes((SubTypes *)&__range1);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void TranslateToFuzzReader::setupHeapTypes() {
  // Start with any existing heap types in the module, which may exist in any
  // initial content we began with.
  auto possibleHeapTypes = ModuleUtils::collectHeapTypes(wasm);

  // Filter away uninhabitable heap types, that is, heap types that we cannot
  // construct, like a type with a non-nullable reference to itself.
  interestingHeapTypes = HeapTypeGenerator::getInhabitable(possibleHeapTypes);

  // For GC, also generate random types.
  if (wasm.features.hasGC()) {
    auto generator = HeapTypeGenerator::create(
      random, wasm.features, upTo(fuzzParams->MAX_NEW_GC_TYPES));
    auto result = generator.builder.build();
    if (auto* err = result.getError()) {
      Fatal() << "Failed to build heap types: " << err->reason << " at index "
              << err->index;
    }

    // Make the new types inhabitable. This process modifies existing types, so
    // it leaves more available compared to HeapTypeGenerator::getInhabitable.
    // We run that before on existing content, which may have instructions that
    // use the types, as editing them is not trivial, and for new types here we
    // are free to modify them so we keep as many as we can.
    auto inhabitable = HeapTypeGenerator::makeInhabitable(*result);
    for (auto type : inhabitable) {
      // Trivial types are already handled specifically in e.g.
      // getSingleConcreteType(), and we avoid adding them here as then we'd
      // need to add code to avoid uninhabitable combinations of them (like a
      // non-nullable bottom heap type).
      if (!type.isBottom() && !type.isBasic()) {
        interestingHeapTypes.push_back(type);
        if (oneIn(2)) {
          // Add a name for this type.
          wasm.typeNames[type].name =
            "generated_type$" + std::to_string(interestingHeapTypes.size());
        }
      }
    }
  }

  // Compute subtypes ahead of time. It is more efficient to do this all at once
  // now, rather than lazily later.
  SubTypes subTypes(interestingHeapTypes);
  for (auto type : interestingHeapTypes) {
    for (auto subType : subTypes.getImmediateSubTypes(type)) {
      interestingHeapSubTypes[type].push_back(subType);
    }
    // Basic types must be handled directly, since subTypes doesn't look at
    // those.
    auto share = type.getShared();
    auto struct_ = HeapTypes::struct_.getBasic(share);
    auto array = HeapTypes::array.getBasic(share);
    auto eq = HeapTypes::eq.getBasic(share);
    auto any = HeapTypes::any.getBasic(share);
    auto func = HeapTypes::func.getBasic(share);
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        interestingHeapSubTypes[func].push_back(type);
        break;
      case HeapTypeKind::Struct: {
        interestingHeapSubTypes[struct_].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        // Note the mutable fields.
        auto& fields = type.getStruct().fields;
        for (Index i = 0; i < fields.size(); i++) {
          if (fields[i].mutable_) {
            mutableStructFields.push_back(StructField{type, i});
          }
        }
        break;
      }
      case HeapTypeKind::Array:
        interestingHeapSubTypes[array].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        if (type.getArray().element.mutable_) {
          mutableArrays.push_back(type);
        }
        break;
      case HeapTypeKind::Cont:
        WASM_UNREACHABLE("TODO: cont");
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }

  // Compute struct and array fields.
  for (auto type : interestingHeapTypes) {
    if (type.isStruct()) {
      auto& fields = type.getStruct().fields;
      for (Index i = 0; i < fields.size(); i++) {
        typeStructFields[fields[i].type].push_back(StructField{type, i});
      }
    } else if (type.isArray()) {
      typeArrays[type.getArray().element.type].push_back(type);
    }
  }
}